

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# discrete_dist.hpp
# Opt level: O0

int __thiscall trng::discrete_dist::operator()(discrete_dist *this,lcg64_shift *r)

{
  reference pvVar1;
  vector<double,_std::allocator<double>_> *in_RDI;
  size_type x;
  double u;
  pointer local_28;
  double local_20;
  int local_4;
  
  if (in_RDI[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start == (pointer)0x0) {
    local_4 = -1;
  }
  else {
    local_20 = utility::uniformco<double,trng::lcg64_shift>((lcg64_shift *)0x395906);
    pvVar1 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,0);
    local_20 = local_20 * *pvVar1;
    local_28 = (pointer)0x0;
    while (local_28 <
           in_RDI[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage) {
      pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                         (in_RDI,(long)local_28 * 2 + 1);
      if (*pvVar1 <= local_20) {
        pvVar1 = std::vector<double,_std::allocator<double>_>::operator[]
                           (in_RDI,(long)local_28 * 2 + 1);
        local_20 = local_20 - *pvVar1;
        local_28 = (pointer)((long)local_28 * 2 + 2);
      }
      else {
        local_28 = (pointer)((long)local_28 * 2 + 1);
      }
    }
    local_4 = (int)local_28 -
              (int)in_RDI[1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
  }
  return local_4;
}

Assistant:

int operator()(R &r) {
      if (P.N_ == 0)
        return -1;
      double u(utility::uniformco<double>(r) * P.P_[0]);
      param_type::size_type x{0};
      while (x < P.offset_) {
        if (u < P.P_[2 * x + 1]) {
          x = 2 * x + 1;
        } else {
          u -= P.P_[2 * x + 1];
          x = 2 * x + 2;
        }
      }
      return static_cast<int>(x - P.offset_);
    }